

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O1

void __thiscall randomx::JitCompilerX86::generateCode(JitCompilerX86 *this,Instruction *instr,int i)

{
  iterator __position;
  code *UNRECOVERED_JUMPTABLE;
  long lVar1;
  long *plVar2;
  
  __position._M_current =
       (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this,__position,&this->codePos);
  }
  else {
    *__position._M_current = this->codePos;
    (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  lVar1 = (ulong)instr->opcode * 0x10;
  UNRECOVERED_JUMPTABLE = *(code **)(engine + lVar1);
  plVar2 = (long *)((long)this->registerUsage + *(long *)(engine + lVar1 + 8) + -0x18);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar2 + -1);
  }
  (*UNRECOVERED_JUMPTABLE)(plVar2,instr,i);
  return;
}

Assistant:

void JitCompilerX86::generateCode(Instruction& instr, int i) {
		instructionOffsets.push_back(codePos);
		auto generator = engine[instr.opcode];
		(this->*generator)(instr, i);
	}